

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

void __thiscall BoardView::ShowInfoPane(BoardView *this)

{
  ImVec2 IVar1;
  bool bVar2;
  undefined1 uVar3;
  byte bVar4;
  vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *this_00;
  size_type sVar5;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *this_01;
  vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *this_02;
  reference pvVar6;
  undefined8 uVar7;
  element_type *peVar8;
  long lVar9;
  element_type *peVar10;
  int iVar11;
  long in_RDI;
  float fVar12;
  float fVar13;
  float fVar14;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  shared_ptr<Component> p;
  iterator __end7;
  iterator __begin7;
  SharedVector<Component> *__range7;
  char ss [1024];
  shared_ptr<Pin> pin_1;
  iterator __end4_1;
  iterator __begin4_1;
  SharedVector<Pin> *__range4_1;
  int pc;
  ImVec2 listSize;
  string str;
  string pdfButtonName;
  shared_ptr<Pin> *pin;
  iterator __end4;
  iterator __begin4;
  SharedVector<Pin> *__range4;
  string to_copy;
  char name_and_id [128];
  ImVec2 psz_1;
  char bn [128];
  ImVec2 psz;
  shared_ptr<Component> part;
  iterator __end2;
  iterator __begin2;
  SharedVector<Component> *__range2;
  ImVec2 delta;
  ImDrawList *draw;
  ImVec2 ds;
  ImGuiIO *io;
  int in_stack_00002fcc;
  BoardView *in_stack_00002fd0;
  float in_stack_fffffffffffff6a8;
  float in_stack_fffffffffffff6ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6b8;
  undefined4 in_stack_fffffffffffff6c0;
  undefined2 in_stack_fffffffffffff6c4;
  undefined1 in_stack_fffffffffffff6c6;
  undefined1 in_stack_fffffffffffff6c7;
  BoardView *in_stack_fffffffffffff6c8;
  Confparse *in_stack_fffffffffffff6d0;
  undefined2 in_stack_fffffffffffff6e0;
  undefined1 in_stack_fffffffffffff6e2;
  undefined1 in_stack_fffffffffffff6e3;
  float in_stack_fffffffffffff6e4;
  float in_stack_fffffffffffff6e8;
  float in_stack_fffffffffffff6ec;
  float in_stack_fffffffffffff6f0;
  float in_stack_fffffffffffff6f4;
  allocator<char> *in_stack_fffffffffffff6f8;
  string *in_stack_fffffffffffff728;
  undefined4 in_stack_fffffffffffff730;
  float in_stack_fffffffffffff734;
  undefined4 in_stack_fffffffffffff7a0;
  float in_stack_fffffffffffff7a4;
  ImVec2 *in_stack_fffffffffffff7a8;
  ImVec2 *in_stack_fffffffffffff7b8;
  float in_stack_fffffffffffff7c0;
  float in_stack_fffffffffffff7c4;
  ImVec2 *in_stack_fffffffffffff7c8;
  bool *in_stack_fffffffffffff7e0;
  undefined6 in_stack_fffffffffffff7e8;
  undefined1 in_stack_fffffffffffff7ee;
  undefined1 in_stack_fffffffffffff7ef;
  string local_7d8 [48];
  shared_ptr<Component> *local_7a8;
  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
  local_7a0;
  long local_798;
  ImVec2 local_790;
  undefined1 local_788 [644];
  ImGuiWindowFlags in_stack_fffffffffffffafc;
  bool *in_stack_fffffffffffffb00;
  char *in_stack_fffffffffffffb08;
  __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
  local_368;
  SharedVector<Pin> *local_360;
  ImVec2 local_354;
  int local_34c;
  ImVec2 local_348;
  allocator<char> local_339;
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  reference local_278;
  shared_ptr<Pin> *local_270;
  __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
  local_268;
  SharedVector<Pin> *local_260;
  string local_258 [32];
  string local_238 [32];
  char local_218 [128];
  ImVec2 local_198;
  ImVec2 local_190 [3];
  char local_178 [136];
  ImVec2 local_f0;
  ImVec2 local_e8;
  bool local_e0 [16];
  ImVec2 local_d0 [2];
  shared_ptr<Component> *local_c0;
  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
  local_b8;
  long local_b0;
  string local_98 [32];
  string local_78 [32];
  ImVec2 local_58;
  ImVec2 local_40;
  ImVec2 local_38;
  ImDrawList *local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImGuiIO *local_10;
  
  local_10 = ImGui::GetIO();
  local_18 = local_10->DisplaySize;
  if ((*(byte *)(in_RDI + 0xcad2) & 1) != 0) {
    fVar13 = *(float *)(in_RDI + 0xd5f8);
    fVar12 = DPIF(100.0);
    if (fVar13 < fVar12) {
      fVar13 = DPIF(100.0);
      *(float *)(in_RDI + 0xd5f8) = fVar13 + 1.0;
      *(float *)(in_RDI + 0xd5f0) = local_18.x - *(float *)(in_RDI + 0xd5f8);
    }
    *(undefined4 *)(in_RDI + 0xd5fc) = *(undefined4 *)(in_RDI + 0xd5f4);
    ImVec2::ImVec2(&local_20,local_18.x - *(float *)(in_RDI + 0xd5f8),*(float *)(in_RDI + 0xd5e8));
    ImVec2::ImVec2(&local_28,0.0,0.0);
    ImGui::SetNextWindowPos(&local_20,0,&local_28);
    ImGui::SetNextWindowSize((ImVec2 *)(in_RDI + 0xd5f8),0);
    ImGui::PushStyleVar((ImGuiStyleVar)((ulong)in_stack_fffffffffffff6d0 >> 0x20),
                        SUB84(in_stack_fffffffffffff6d0,0));
    ImGui::Begin(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
    if (((*(int *)(in_RDI + 0xd600) == 0) &&
        (fVar13 = (local_10->MousePos).x,
        *(float *)(in_RDI + 0xd5f0) <= fVar13 && fVar13 != *(float *)(in_RDI + 0xd5f0))) &&
       (fVar13 = (local_10->MousePos).x, fVar12 = *(float *)(in_RDI + 0xd5f0), fVar14 = DPIF(12.0),
       fVar13 < fVar12 + fVar14)) {
      local_30 = ImGui::GetWindowDrawList();
      ImVec2::ImVec2(&local_38,*(float *)(in_RDI + 0xd5f0),*(float *)(in_RDI + 0xd5e8));
      fVar13 = *(float *)(in_RDI + 0xd5f0);
      fVar12 = DPIF(12.0);
      ImVec2::ImVec2(&local_40,fVar13 + fVar12,
                     *(float *)(in_RDI + 0xd5f4) + *(float *)(in_RDI + 0xd5e8));
      ImColor::ImColor((ImColor *)in_stack_fffffffffffff6b0,(ImU32)in_stack_fffffffffffff6ac);
      ImColor::operator_cast_to_unsigned_int((ImColor *)0x11f6be);
      ImDrawList::AddRectFilled
                ((ImDrawList *)in_stack_fffffffffffff6d0,(ImVec2 *)in_stack_fffffffffffff6c8,
                 (ImVec2 *)
                 CONCAT17(in_stack_fffffffffffff6c7,
                          CONCAT16(in_stack_fffffffffffff6c6,
                                   CONCAT24(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0))),
                 (ImU32)((ulong)in_stack_fffffffffffff6b8 >> 0x20),
                 SUB84(in_stack_fffffffffffff6b8,0),
                 (ImDrawFlags)((ulong)in_stack_fffffffffffff6b0 >> 0x20));
    }
    bVar2 = ImGui::IsMouseDragging
                      ((ImGuiMouseButton)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6ac);
    if (bVar2) {
      if (((*(int *)(in_RDI + 0xd600) == 0) &&
          (fVar13 = local_10->MouseClickedPos[0].x,
          *(float *)(in_RDI + 0xd5f0) <= fVar13 && fVar13 != *(float *)(in_RDI + 0xd5f0))) &&
         (fVar13 = local_10->MouseClickedPos[0].x, fVar12 = *(float *)(in_RDI + 0xd5f0),
         fVar14 = DPIF(20.0), fVar13 < fVar12 + fVar14)) {
        *(undefined4 *)(in_RDI + 0xd600) = 2;
      }
      if (*(int *)(in_RDI + 0xd600) == 2) {
        iVar11 = 0;
        local_58 = ImGui::GetMouseDragDelta
                             ((ImGuiMouseButton)in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8)
        ;
        std::abs(iVar11);
        if ((500.0 < extraout_XMM0_Da) || (std::abs(iVar11), 500.0 < extraout_XMM0_Da_00)) {
          local_58.x = 0.0;
          local_58.y = 0.0;
        }
        ImGui::ResetMouseDragDelta(0);
        *(float *)(in_RDI + 0xd5f0) = local_58.x + *(float *)(in_RDI + 0xd5f0);
        *(float *)(in_RDI + 0xd5f8) = local_18.x - *(float *)(in_RDI + 0xd5f0);
        if (*(float *)(in_RDI + 0xd5f0) < local_18.x * 0.66) {
          *(float *)(in_RDI + 0xd5f0) = local_18.x * 0.66;
          *(float *)(in_RDI + 0xd5f8) = local_18.x - *(float *)(in_RDI + 0xd5f0);
        }
        if (0.0 < local_58.x) {
          *(undefined1 *)(in_RDI + 0xd6a6) = 1;
        }
      }
    }
    else {
      if (*(int *)(in_RDI + 0xd600) == 2) {
        *(int *)(in_RDI + 0xcad4) = (int)*(float *)(in_RDI + 0xd5f8);
        Confparse::WriteInt(in_stack_fffffffffffff6d0,(char *)in_stack_fffffffffffff6c8,
                            CONCAT13(in_stack_fffffffffffff6c7,
                                     CONCAT12(in_stack_fffffffffffff6c6,in_stack_fffffffffffff6c4)))
        ;
      }
      *(undefined4 *)(in_RDI + 0xd600) = 0;
    }
    if (*(long *)(in_RDI + 8) == 0) {
      ImGui::Text("No board currently loaded.");
    }
    else {
      ImGui::Columns((int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),
                     (char *)in_stack_fffffffffffff6c8,(bool)in_stack_fffffffffffff6c7);
      this_00 = (vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                (**(code **)(**(long **)(in_RDI + 8) + 0x20))();
      sVar5 = std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::size
                        (this_00);
      ImGui::Text("Pins: %zu",sVar5);
      this_01 = (vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
                (**(code **)(**(long **)(in_RDI + 8) + 0x18))();
      sVar5 = std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
              ::size(this_01);
      ImGui::Text("Parts: %zu",sVar5);
      ImGui::NextColumn();
      this_02 = (vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
                (**(code **)(**(long **)(in_RDI + 8) + 0x10))();
      sVar5 = std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::size
                        (this_02);
      ImGui::Text("Nets: %zu",sVar5);
      ImGui::TextWrapped((char *)(double)((float)*(int *)(in_RDI + 0xd5e0) / 1000.0),
                         "Size: %0.2f x %0.2f\"");
      ImGui::Columns((int)((ulong)in_stack_fffffffffffff6d0 >> 0x20),
                     (char *)in_stack_fffffffffffff6c8,(bool)in_stack_fffffffffffff6c7);
      ImGui::Separator();
      bVar2 = ImGui::Checkbox((char *)CONCAT17(in_stack_fffffffffffff7ef,
                                               CONCAT16(in_stack_fffffffffffff7ee,
                                                        in_stack_fffffffffffff7e8)),
                              in_stack_fffffffffffff7e0);
      if (bVar2) {
        Confparse::WriteBool
                  ((Confparse *)
                   CONCAT17(in_stack_fffffffffffff6c7,
                            CONCAT16(in_stack_fffffffffffff6c6,
                                     CONCAT24(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0)))
                   ,(char *)in_stack_fffffffffffff6b8,
                   SUB81((ulong)in_stack_fffffffffffff6b0 >> 0x38,0));
      }
      bVar2 = ImGui::Checkbox((char *)CONCAT17(in_stack_fffffffffffff7ef,
                                               CONCAT16(in_stack_fffffffffffff7ee,
                                                        in_stack_fffffffffffff7e8)),
                              in_stack_fffffffffffff7e0);
      if (bVar2) {
        Confparse::WriteBool
                  ((Confparse *)
                   CONCAT17(in_stack_fffffffffffff6c7,
                            CONCAT16(in_stack_fffffffffffff6c6,
                                     CONCAT24(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0)))
                   ,(char *)in_stack_fffffffffffff6b8,
                   SUB81((ulong)in_stack_fffffffffffff6b0 >> 0x38,0));
      }
    }
    sVar5 = std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
            size((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *
                 )(in_RDI + 0xd288));
    if (sVar5 != 0) {
      ImGui::Separator();
      std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::size
                ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *
                 )(in_RDI + 0xd288));
      std::__cxx11::to_string(CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8));
      std::operator+(in_stack_fffffffffffff6b8,(char *)in_stack_fffffffffffff6b0);
      std::__cxx11::string::c_str();
      ImGui::TextUnformatted
                ((char *)in_stack_fffffffffffff6b0,
                 (char *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::~string(local_98);
      local_b0 = in_RDI + 0xd288;
      local_b8._M_current =
           (shared_ptr<Component> *)
           std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
           begin((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *
                 )CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
      local_c0 = (shared_ptr<Component> *)
                 std::
                 vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
                 end((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                      *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                                 *)in_stack_fffffffffffff6b0,
                                (__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8)),
            bVar2) {
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
        ::operator*(&local_b8);
        std::shared_ptr<Component>::shared_ptr
                  ((shared_ptr<Component> *)in_stack_fffffffffffff6b0,
                   (shared_ptr<Component> *)
                   CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
        ImGui::Text(" ");
        std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x11fc3b);
        std::__cxx11::string::c_str();
        uVar3 = ImGui::SmallButton((char *)CONCAT17(in_stack_fffffffffffff6c7,
                                                    CONCAT16(in_stack_fffffffffffff6c6,
                                                             CONCAT24(in_stack_fffffffffffff6c4,
                                                                      in_stack_fffffffffffff6c0))));
        if ((bool)uVar3) {
          in_stack_fffffffffffff7e0 = local_e0;
          std::shared_ptr<BoardElement>::shared_ptr<Component,void>
                    ((shared_ptr<BoardElement> *)in_stack_fffffffffffff6b0,
                     (shared_ptr<Component> *)
                     CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
          in_stack_fffffffffffff7ee =
               BoardElementIsVisible
                         (in_stack_fffffffffffff6c8,
                          (shared_ptr<BoardElement> *)
                          CONCAT17(in_stack_fffffffffffff6c7,
                                   CONCAT16(in_stack_fffffffffffff6c6,
                                            CONCAT24(in_stack_fffffffffffff6c4,
                                                     in_stack_fffffffffffff6c0))));
          bVar4 = in_stack_fffffffffffff7ee ^ 0xff;
          std::shared_ptr<BoardElement>::~shared_ptr((shared_ptr<BoardElement> *)0x11fcc0);
          if ((bVar4 & 1) != 0) {
            FlipBoard(in_stack_00002fd0,in_stack_00002fcc);
          }
          peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x11fd7b);
          fVar13 = (peVar8->centerpoint).x;
          if ((fVar13 != 0.0) || (NAN(fVar13))) {
            peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x11fd9f);
            fVar13 = (peVar8->centerpoint).y;
            if ((fVar13 == 0.0) && (!NAN(fVar13))) goto LAB_00120021;
            ImVec2::ImVec2(&local_e8);
            in_stack_fffffffffffff7c8 = local_d0;
            std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x11fdda);
            std::array<ImVec2,_4UL>::operator[]
                      ((array<ImVec2,_4UL> *)in_stack_fffffffffffff6b0,
                       CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
            peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x11fe05);
            iVar11 = (int)peVar8 + 0x70;
            std::array<ImVec2,_4UL>::operator[]
                      ((array<ImVec2,_4UL> *)in_stack_fffffffffffff6b0,
                       CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
            std::abs(iVar11);
            fVar13 = *(float *)(in_RDI + 0xd5c8);
            fVar12 = *(float *)(in_RDI + 0xd5f0);
            in_stack_fffffffffffff7b8 = local_d0;
            std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x11fe7d);
            pvVar6 = std::array<ImVec2,_4UL>::operator[]
                               ((array<ImVec2,_4UL> *)in_stack_fffffffffffff6b0,
                                CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
            in_stack_fffffffffffff7c0 = pvVar6->y;
            peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x11fea9);
            iVar11 = (int)peVar8 + 0x70;
            std::array<ImVec2,_4UL>::operator[]
                      ((array<ImVec2,_4UL> *)in_stack_fffffffffffff6b0,
                       CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
            std::abs(iVar11);
            in_stack_fffffffffffff7c4 = extraout_XMM0_Da_02;
            ImVec2::ImVec2(&local_f0,(extraout_XMM0_Da_01 * fVar13) / fVar12,
                           (extraout_XMM0_Da_02 * *(float *)(in_RDI + 0xd5c8)) /
                           *(float *)(in_RDI + 0xd5f4));
            local_e8 = local_f0;
            IVar1 = local_e8;
            local_e8.x = local_f0.x;
            local_e8.y = local_f0.y;
            if ((1.0 < local_e8.x) || (1.0 < local_e8.y)) {
              if (local_e8.x <= local_e8.y) {
                *(float *)(in_RDI + 0xd5c8) =
                     *(float *)(in_RDI + 0xd5c8) / (*(float *)(in_RDI + 0xcaa4) * local_e8.y);
              }
              else {
                *(float *)(in_RDI + 0xd5c8) =
                     *(float *)(in_RDI + 0xd5c8) / (*(float *)(in_RDI + 0xcaa4) * local_e8.x);
              }
            }
            in_stack_fffffffffffff7a8 = local_d0;
            local_e8 = IVar1;
            std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x11ffde);
            std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x11fffc);
            SetTarget((BoardView *)
                      CONCAT17(in_stack_fffffffffffff6c7,
                               CONCAT16(in_stack_fffffffffffff6c6,
                                        CONCAT24(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0
                                                ))),
                      (float)((ulong)in_stack_fffffffffffff6b8 >> 0x20),
                      SUB84(in_stack_fffffffffffff6b8,0));
          }
          else {
LAB_00120021:
            peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x120036);
            std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::operator[]
                      (&peVar8->pins,0);
            peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x120056);
            in_stack_fffffffffffff7a4 = (peVar10->position).x;
            peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x120071);
            std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::operator[]
                      (&peVar8->pins,0);
            std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x12008d);
            SetTarget((BoardView *)
                      CONCAT17(in_stack_fffffffffffff6c7,
                               CONCAT16(in_stack_fffffffffffff6c6,
                                        CONCAT24(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0
                                                ))),
                      (float)((ulong)in_stack_fffffffffffff6b8 >> 0x20),
                      SUB84(in_stack_fffffffffffff6b8,0));
          }
          *(undefined1 *)(in_RDI + 0xd6a6) = 1;
        }
        ImGui::SameLine(0.0,-1.0);
        std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1200da);
        uVar7 = std::__cxx11::string::c_str();
        snprintf(local_178,0x80,"Z##%s",uVar7);
        bVar2 = ImGui::SmallButton((char *)CONCAT17(in_stack_fffffffffffff6c7,
                                                    CONCAT16(in_stack_fffffffffffff6c6,
                                                             CONCAT24(in_stack_fffffffffffff6c4,
                                                                      in_stack_fffffffffffff6c0))));
        if (bVar2) {
          std::shared_ptr<BoardElement>::shared_ptr<Component,void>
                    ((shared_ptr<BoardElement> *)in_stack_fffffffffffff6b0,
                     (shared_ptr<Component> *)
                     CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
          bVar2 = BoardElementIsVisible
                            (in_stack_fffffffffffff6c8,
                             (shared_ptr<BoardElement> *)
                             CONCAT17(in_stack_fffffffffffff6c7,
                                      CONCAT16(in_stack_fffffffffffff6c6,
                                               CONCAT24(in_stack_fffffffffffff6c4,
                                                        in_stack_fffffffffffff6c0))));
          std::shared_ptr<BoardElement>::~shared_ptr((shared_ptr<BoardElement> *)0x12018a);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            FlipBoard(in_stack_00002fd0,in_stack_00002fcc);
          }
          peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1201dd);
          fVar13 = (peVar8->centerpoint).x;
          if ((fVar13 != 0.0) || (NAN(fVar13))) {
            peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x120201);
            fVar13 = (peVar8->centerpoint).y;
            if ((fVar13 == 0.0) && (!NAN(fVar13))) goto LAB_00120455;
            ImVec2::ImVec2(local_190);
            std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x12023c);
            std::array<ImVec2,_4UL>::operator[]
                      ((array<ImVec2,_4UL> *)in_stack_fffffffffffff6b0,
                       CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
            peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x120267);
            iVar11 = (int)peVar8 + 0x70;
            std::array<ImVec2,_4UL>::operator[]
                      ((array<ImVec2,_4UL> *)in_stack_fffffffffffff6b0,
                       CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
            std::abs(iVar11);
            fVar13 = *(float *)(in_RDI + 0xd5c8);
            fVar12 = *(float *)(in_RDI + 0xd5f0);
            std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x1202df);
            std::array<ImVec2,_4UL>::operator[]
                      ((array<ImVec2,_4UL> *)in_stack_fffffffffffff6b0,
                       CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
            peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x12030b);
            iVar11 = (int)peVar8 + 0x70;
            std::array<ImVec2,_4UL>::operator[]
                      ((array<ImVec2,_4UL> *)in_stack_fffffffffffff6b0,
                       CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
            std::abs(iVar11);
            ImVec2::ImVec2(&local_198,(extraout_XMM0_Da_03 * fVar13) / fVar12,
                           (extraout_XMM0_Da_04 * *(float *)(in_RDI + 0xd5c8)) /
                           *(float *)(in_RDI + 0xd5f4));
            local_190[0] = local_198;
            IVar1 = local_190[0];
            local_190[0].x = local_198.x;
            local_190[0].y = local_198.y;
            if (local_190[0].x <= local_190[0].y) {
              *(float *)(in_RDI + 0xd5c8) =
                   *(float *)(in_RDI + 0xd5c8) / (*(float *)(in_RDI + 0xcaa4) * local_190[0].y);
            }
            else {
              *(float *)(in_RDI + 0xd5c8) =
                   *(float *)(in_RDI + 0xd5c8) / (*(float *)(in_RDI + 0xcaa4) * local_190[0].x);
            }
            local_190[0] = IVar1;
            std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x120412);
            std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x120430);
            SetTarget((BoardView *)
                      CONCAT17(in_stack_fffffffffffff6c7,
                               CONCAT16(in_stack_fffffffffffff6c6,
                                        CONCAT24(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0
                                                ))),
                      (float)((ulong)in_stack_fffffffffffff6b8 >> 0x20),
                      SUB84(in_stack_fffffffffffff6b8,0));
          }
          else {
LAB_00120455:
            peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x120467);
            in_stack_fffffffffffff728 = (string *)0x0;
            std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::operator[]
                      (&peVar8->pins,0);
            peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                      operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x120487);
            in_stack_fffffffffffff734 = (peVar10->position).x;
            peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x12049f);
            std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::operator[]
                      (&peVar8->pins,(size_type)in_stack_fffffffffffff728);
            std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x1204bb);
            SetTarget((BoardView *)
                      CONCAT17(in_stack_fffffffffffff6c7,
                               CONCAT16(in_stack_fffffffffffff6c6,
                                        CONCAT24(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0
                                                ))),
                      (float)((ulong)in_stack_fffffffffffff6b8 >> 0x20),
                      SUB84(in_stack_fffffffffffff6b8,0));
          }
          *(undefined1 *)(in_RDI + 0xd6a6) = 1;
        }
        ImGui::SameLine(0.0,-1.0);
        peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x120508);
        sVar5 = std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::size
                          (&peVar8->pins);
        ImGui::Text("%zu Pin(s)",sVar5);
        ImGui::SameLine(0.0,-1.0);
        std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x120546);
        uVar7 = std::__cxx11::string::c_str();
        snprintf(local_218,0x80,"Copy##%s",uVar7);
        bVar2 = ImGui::SmallButton((char *)CONCAT17(in_stack_fffffffffffff6c7,
                                                    CONCAT16(in_stack_fffffffffffff6c6,
                                                             CONCAT24(in_stack_fffffffffffff6c4,
                                                                      in_stack_fffffffffffff6c0))));
        if (bVar2) {
          peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x12059f);
          std::__cxx11::string::string(local_238,(string *)&peVar8->name);
          std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1205c2);
          lVar9 = std::__cxx11::string::size();
          if (lVar9 != 0) {
            std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x1205e5);
            std::operator+((char *)in_stack_fffffffffffff6f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
            std::__cxx11::string::operator+=(local_238,local_258);
            std::__cxx11::string::~string(local_258);
          }
          peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x120674);
          local_260 = &peVar8->pins;
          local_268._M_current =
               (shared_ptr<Pin> *)
               std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::begin
                         ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                          CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
          local_270 = (shared_ptr<Pin> *)
                      std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::end
                                ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                                     *)in_stack_fffffffffffff6b0,
                                    (__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                                     *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8)
                                   ), bVar2) {
            local_278 = __gnu_cxx::
                        __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                        ::operator*(&local_268);
            std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x1206ea);
            std::operator+((char *)in_stack_fffffffffffff6f8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
            std::operator+(in_stack_fffffffffffff6b8,(char *)in_stack_fffffffffffff6b0);
            std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x120732);
            std::operator+(in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0);
            std::__cxx11::string::operator+=(local_238,local_298);
            std::__cxx11::string::~string(local_298);
            std::__cxx11::string::~string(local_2b8);
            std::__cxx11::string::~string(local_2d8);
            __gnu_cxx::
            __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
            ::operator++(&local_268);
          }
          std::__cxx11::string::c_str();
          ImGui::SetClipboardText((char *)in_stack_fffffffffffff6b0);
          std::__cxx11::string::~string(local_238);
        }
        std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x12084f);
        std::operator+((char *)in_stack_fffffffffffff6f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0));
        std::__cxx11::string::c_str();
        bVar2 = ImGui::SmallButton((char *)CONCAT17(in_stack_fffffffffffff6c7,
                                                    CONCAT16(in_stack_fffffffffffff6c6,
                                                             CONCAT24(in_stack_fffffffffffff6c4,
                                                                      in_stack_fffffffffffff6c0))));
        if (bVar2) {
          std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x1208b1);
          PDFBridgeEvince::DocumentSearch
                    ((PDFBridgeEvince *)in_stack_fffffffffffff6d0,
                     (string *)in_stack_fffffffffffff6c8,(bool)in_stack_fffffffffffff6c7,
                     (bool)in_stack_fffffffffffff6c6);
        }
        ImGui::SameLine(0.0,-1.0);
        ImGui::Checkbox((char *)CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffff7ee,
                                                        in_stack_fffffffffffff7e8)),
                        in_stack_fffffffffffff7e0);
        ImGui::SameLine(0.0,-1.0);
        ImGui::Checkbox((char *)CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffff7ee,
                                                        in_stack_fffffffffffff7e8)),
                        in_stack_fffffffffffff7e0);
        std::__cxx11::string::~string(local_2f8);
        std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x120968);
        lVar9 = std::__cxx11::string::size();
        if (lVar9 != 0) {
          std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x120987);
          uVar7 = std::__cxx11::string::c_str();
          ImGui::TextWrapped("%s",uVar7);
        }
        ImGui::PushItemWidth
                  ((float)CONCAT13(in_stack_fffffffffffff6c7,
                                   CONCAT12(in_stack_fffffffffffff6c6,in_stack_fffffffffffff6c4)));
        in_stack_fffffffffffff6f8 = &local_339;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff6f4,in_stack_fffffffffffff6f0),
                   (char *)CONCAT44(in_stack_fffffffffffff6ec,in_stack_fffffffffffff6e8),
                   (allocator<char> *)
                   CONCAT44(in_stack_fffffffffffff6e4,
                            CONCAT13(in_stack_fffffffffffff6e3,
                                     CONCAT12(in_stack_fffffffffffff6e2,in_stack_fffffffffffff6e0)))
                  );
        std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1209f1);
        std::operator+(in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0);
        std::__cxx11::string::~string(local_338);
        std::allocator<char>::~allocator(&local_339);
        ImVec2::ImVec2(&local_348);
        peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x120a45);
        sVar5 = std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::size
                          (&peVar8->pins);
        local_34c = (int)sVar5;
        if (0x14 < local_34c) {
          local_34c = 0x14;
        }
        in_stack_fffffffffffff6f0 = *(float *)(in_RDI + 0xd5f8);
        in_stack_fffffffffffff6f4 = DPIF(50.0);
        in_stack_fffffffffffff6e4 = in_stack_fffffffffffff6f0 - in_stack_fffffffffffff6f4;
        in_stack_fffffffffffff6e8 = (float)local_34c;
        in_stack_fffffffffffff6ec = ImGui::GetFontSize();
        ImVec2::ImVec2(&local_354,in_stack_fffffffffffff6e4,
                       in_stack_fffffffffffff6e8 * in_stack_fffffffffffff6ec * 1.45);
        local_348 = local_354;
        std::__cxx11::string::c_str();
        in_stack_fffffffffffff6e3 =
             ImGui::BeginListBox((char *)in_stack_fffffffffffff7a8,
                                 (ImVec2 *)
                                 CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0));
        if ((bool)in_stack_fffffffffffff6e3) {
          peVar8 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x120bb4);
          local_360 = &peVar8->pins;
          local_368._M_current =
               (shared_ptr<Pin> *)
               std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::begin
                         ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                          CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
          std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::end
                    ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                     CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
          while (bVar2 = __gnu_cxx::operator!=
                                   ((__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                                     *)in_stack_fffffffffffff6b0,
                                    (__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                                     *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8)
                                   ), bVar2) {
            __gnu_cxx::
            __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
            ::operator*(&local_368);
            std::shared_ptr<Pin>::shared_ptr
                      ((shared_ptr<Pin> *)in_stack_fffffffffffff6b0,
                       (shared_ptr<Pin> *)
                       CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
            std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x120c34);
            in_stack_fffffffffffff6c8 = (BoardView *)std::__cxx11::string::c_str();
            std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x120c4f);
            uVar7 = std::__cxx11::string::c_str();
            in_stack_fffffffffffff6d0 = (Confparse *)local_788;
            snprintf((char *)in_stack_fffffffffffff6d0,0x400,"%4s  %s",in_stack_fffffffffffff6c8,
                     uVar7);
            in_stack_fffffffffffff6e2 =
                 std::operator==((shared_ptr<Pin> *)in_stack_fffffffffffff6b0,
                                 (shared_ptr<Pin> *)
                                 CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
            ImVec2::ImVec2(&local_790,0.0,0.0);
            in_stack_fffffffffffff6c7 =
                 ImGui::Selectable((char *)in_stack_fffffffffffff7c8,
                                   SUB41((uint)in_stack_fffffffffffff7c4 >> 0x18,0),
                                   (ImGuiSelectableFlags)in_stack_fffffffffffff7c0,
                                   in_stack_fffffffffffff7b8);
            if ((bool)in_stack_fffffffffffff6c7) {
              ClearAllHighlights((BoardView *)
                                 CONCAT44(in_stack_fffffffffffff6e4,
                                          CONCAT13(in_stack_fffffffffffff6e3,
                                                   CONCAT12(in_stack_fffffffffffff6e2,
                                                            in_stack_fffffffffffff6e0))));
              peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                        operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x120d03);
              if (((*(int *)&(peVar10->super_BoardElement).field_0xc == 1) ||
                  (peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)0x120d16),
                  *(int *)&(peVar10->super_BoardElement).field_0xc == 0)) ||
                 (peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                          *)0x120d29), (peVar10->net->is_ground & 1U) != 0)) {
                in_stack_fffffffffffff6b8 =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (in_RDI + 0xd288);
                std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                          ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           0x120d53);
                std::
                vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
                push_back((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                           *)CONCAT17(in_stack_fffffffffffff6c7,
                                      CONCAT16(in_stack_fffffffffffff6c6,
                                               CONCAT24(in_stack_fffffffffffff6c4,
                                                        in_stack_fffffffffffff6c0))),
                          (value_type *)in_stack_fffffffffffff6b8);
              }
              else {
                std::shared_ptr<Pin>::operator=
                          ((shared_ptr<Pin> *)in_stack_fffffffffffff6b0,
                           (shared_ptr<Pin> *)
                           CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
                local_798 = in_RDI + 0xd288;
                local_7a0._M_current =
                     (shared_ptr<Component> *)
                     std::
                     vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                     ::begin((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                              *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
                local_7a8 = (shared_ptr<Component> *)
                            std::
                            vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                            ::end((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
                while (bVar2 = __gnu_cxx::operator!=
                                         ((__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                                           *)in_stack_fffffffffffff6b0,
                                          (__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                                           *)CONCAT44(in_stack_fffffffffffff6ac,
                                                      in_stack_fffffffffffff6a8)), bVar2) {
                  __gnu_cxx::
                  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                  ::operator*(&local_7a0);
                  std::shared_ptr<Component>::shared_ptr
                            ((shared_ptr<Component> *)in_stack_fffffffffffff6b0,
                             (shared_ptr<Component> *)
                             CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8));
                  std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             0x120e25);
                  std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x120e31);
                  std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                             0x120e3e);
                  peVar8 = std::
                           __shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)0x120e4a);
                  peVar8->visualmode = '\0';
                  std::shared_ptr<Component>::~shared_ptr((shared_ptr<Component> *)0x120e5e);
                  __gnu_cxx::
                  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                  ::operator++(&local_7a0);
                }
                in_stack_fffffffffffff6b0 =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (in_RDI + 0xd288);
                std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                          ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                           0x120e90);
                std::
                vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
                push_back((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                           *)CONCAT17(in_stack_fffffffffffff6c7,
                                      CONCAT16(in_stack_fffffffffffff6c6,
                                               CONCAT24(in_stack_fffffffffffff6c4,
                                                        in_stack_fffffffffffff6c0))),
                          (value_type *)in_stack_fffffffffffff6b8);
                peVar10 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                          operator->((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)0x120eb0);
                std::__cxx11::string::string(local_7d8,(string *)&peVar10->net->name);
                CenterZoomNet((BoardView *)
                              CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                              in_stack_fffffffffffff728);
                std::__cxx11::string::~string(local_7d8);
              }
              *(undefined1 *)(in_RDI + 0xd6a6) = 1;
            }
            ImGui::PushStyleColor
                      ((ImGuiCol)((ulong)in_stack_fffffffffffff6d0 >> 0x20),
                       (ImU32)in_stack_fffffffffffff6d0);
            ImGui::Separator();
            ImGui::PopStyleColor((int)((ulong)in_stack_fffffffffffff6b0 >> 0x20));
            std::shared_ptr<Pin>::~shared_ptr((shared_ptr<Pin> *)0x120f50);
            __gnu_cxx::
            __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
            ::operator++(&local_368);
          }
          ImGui::EndListBox();
        }
        ImGui::PopItemWidth();
        std::__cxx11::string::~string(local_318);
        std::shared_ptr<Component>::~shared_ptr((shared_ptr<Component> *)0x120f9b);
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
        ::operator++(&local_b8);
      }
      ImGui::Text(" ");
      ImGui::Separator();
      ImGui::Separator();
      ImGui::Separator();
    }
    ImGui::End();
    ImGui::PopStyleVar(CONCAT13(in_stack_fffffffffffff6c7,
                                CONCAT12(in_stack_fffffffffffff6c6,in_stack_fffffffffffff6c4)));
  }
  return;
}

Assistant:

void BoardView::ShowInfoPane(void) {
	ImGuiIO &io = ImGui::GetIO();
	ImVec2 ds   = io.DisplaySize;

	if (!config.showInfoPanel) return;

	if (m_info_surface.x < DPIF(100)) {
		//	fprintf(stderr,"Too small (%f), set to (%f)\n", width, DPIF(100));
		m_info_surface.x  = DPIF(100) + 1;
		m_board_surface.x = ds.x - m_info_surface.x;
	}

	m_info_surface.y = m_board_surface.y;

	/*
	 * Originally the dialog was to follow the cursor but it proved to be an overkill
	 * to try adjust things to keep it within the bounds of the window so as to not
	 * lose the buttons.
	 *
	 * Now it's kept at a fixed point.
	 */
	ImGui::SetNextWindowPos(ImVec2(ds.x - m_info_surface.x, m_menu_height));
	ImGui::SetNextWindowSize(m_info_surface);
	ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 1.0f);
	ImGui::Begin("Info Panel",
	             NULL,
	             ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoResize |
	                 ImGuiWindowFlags_NoSavedSettings);

	if ((m_dragging_token == 0) && (io.MousePos.x > m_board_surface.x) && (io.MousePos.x < (m_board_surface.x + DPIF(12.0f)))) {
		ImDrawList *draw = ImGui::GetWindowDrawList();
		draw->AddRectFilled(ImVec2(m_board_surface.x, m_menu_height),
		                    ImVec2(m_board_surface.x + DPIF(12.0f), m_board_surface.y + m_menu_height),
		                    ImColor(0x88888888));
		//			DrawHex( draw, io.MousePos, DPIF(10.0f), ImColor(0xFF0000FF) );
	}

	if (ImGui::IsMouseDragging(0)) {
		if ((m_dragging_token == 0) && (io.MouseClickedPos[0].x > m_board_surface.x) &&
		    (io.MouseClickedPos[0].x < (m_board_surface.x + DPIF(20.0f))))
			m_dragging_token = 2; // own it.
		if (m_dragging_token == 2) {
			ImVec2 delta = ImGui::GetMouseDragDelta();
			if ((abs(delta.x) > 500) || (abs(delta.y) > 500)) {
				delta.x = 0;
				delta.y = 0;
			} // If the delta values are crazy just drop them (happens when panning
			// off screen). 500 arbritary chosen
			ImGui::ResetMouseDragDelta();
			m_board_surface.x += delta.x;
			m_info_surface.x = ds.x - m_board_surface.x;
			if (m_board_surface.x < ds.x * 0.66) {
				m_board_surface.x = ds.x * 0.66;
				m_info_surface.x  = ds.x - m_board_surface.x;
			}
			if (delta.x > 0) m_needsRedraw = true;
		}
	} else {
		if (m_dragging_token == 2) {
			config.infoPanelWidth = m_info_surface.x;
			obvconfig.WriteInt("infoPanelWidth", m_info_surface.x);
		}
		m_dragging_token = 0;
	}

	if (m_board) {
		ImGui::Columns(2);
		ImGui::Text("Pins: %zu", m_board->Pins().size());
		ImGui::Text("Parts: %zu", m_board->Components().size());
		ImGui::NextColumn();
		ImGui::Text("Nets: %zu", m_board->Nets().size());
		ImGui::TextWrapped("Size: %0.2f x %0.2f\"", m_boardWidth / 1000.0f, m_boardHeight / 1000.0f);
		ImGui::Columns(1);
		ImGui::Separator();
		if (ImGui::Checkbox("Zoom on selected net", &config.infoPanelCenterZoomNets)) {
			obvconfig.WriteBool("infoPanelCenterZoomNets", config.infoPanelCenterZoomNets);
		}
		if (ImGui::Checkbox("Select all parts on net", &config.infoPanelSelectPartsOnNet)) {
			obvconfig.WriteBool("infoPanelSelectPartsOnNet", config.infoPanelSelectPartsOnNet);
		}
	} else {
		ImGui::Text("No board currently loaded.");
	}

	if (m_partHighlighted.size()) {
		ImGui::Separator();
		ImGui::TextUnformatted((std::to_string(m_partHighlighted.size()) + " parts selected").c_str());

		for (auto part : m_partHighlighted) {

			ImGui::Text(" ");

			if (ImGui::SmallButton(part->name.c_str())) {
				if (!BoardElementIsVisible(part)) FlipBoard();
				if (part->centerpoint.x && part->centerpoint.y) {
					ImVec2 psz;

					/*
					 * Check to see if we need to zoom BACK a bit to fit the part in to view
					 */
					psz = ImVec2(abs(part->outline[2].x - part->outline[0].x) * m_scale / m_board_surface.x,
					             abs(part->outline[2].y - part->outline[0].y) * m_scale / m_board_surface.y);
					if ((psz.x > 1) || (psz.y > 1)) {
						if (psz.x > psz.y) {
							m_scale /= (config.partZoomScaleOutFactor * psz.x);
						} else {
							m_scale /= (config.partZoomScaleOutFactor * psz.y);
						}
					}

					SetTarget(part->centerpoint.x, part->centerpoint.y);
				} else {
					SetTarget(part->pins[0]->position.x, part->pins[0]->position.y);
				}
				m_needsRedraw = 1;
			}
			ImGui::SameLine();
			{
				char bn[128];
				snprintf(bn, sizeof(bn), "Z##%s", part->name.c_str());
				if (ImGui::SmallButton(bn)) {
					if (!BoardElementIsVisible(part)) FlipBoard();
					if (part->centerpoint.x && part->centerpoint.y) {
						ImVec2 psz;

						/*
						 * Check to see if we need to zoom BACK a bit to fit the part in to view
						 */
						psz = ImVec2(abs(part->outline[2].x - part->outline[0].x) * m_scale / m_board_surface.x,
						             abs(part->outline[2].y - part->outline[0].y) * m_scale / m_board_surface.y);
						if (psz.x > psz.y) {
							m_scale /= (config.partZoomScaleOutFactor * psz.x);
						} else {
							m_scale /= (config.partZoomScaleOutFactor * psz.y);
						}

						SetTarget(part->centerpoint.x, part->centerpoint.y);
					} else {
						SetTarget(part->pins[0]->position.x, part->pins[0]->position.y);
					}
					m_needsRedraw = 1;
				}
			}

			ImGui::SameLine();
			ImGui::Text("%zu Pin(s)", part->pins.size());
			ImGui::SameLine();
			{
				char name_and_id[128];
				snprintf(name_and_id, sizeof(name_and_id), "Copy##%s", part->name.c_str());
				if (ImGui::SmallButton(name_and_id)) {
					// std::string speed is no concern here, since button action is not in UI rendering loop
					std::string to_copy = part->name;
					if (part->mfgcode.size()) {
						to_copy += " " + part->mfgcode;
					}
					for (const auto &pin : part->pins) {
						to_copy += "\n" + pin->name + " " + pin->net->name;
					}
					ImGui::SetClipboardText(to_copy.c_str());
				}
			}

			{
				static bool wholeWordsOnly = true;
				static bool caseSensitive = false;
				std::string pdfButtonName = "PDF Search##" + part->name;
				if (ImGui::SmallButton(pdfButtonName.c_str())) {
					pdfBridge.DocumentSearch(part->name, wholeWordsOnly, caseSensitive);
				}
				ImGui::SameLine();
				ImGui::Checkbox("Whole words only", &wholeWordsOnly);
				ImGui::SameLine();
				ImGui::Checkbox("Case sensitive", &caseSensitive);
			}

			if (part->mfgcode.size()) ImGui::TextWrapped("%s", part->mfgcode.c_str());

			/*
			 * Generate the pin# and net table
			 */
			ImGui::PushItemWidth(-1);
			std::string str = std::string("##") + part->name;
			ImVec2 listSize;
			int pc = part->pins.size();
			if (pc > 20) pc = 20;
			listSize = ImVec2(m_info_surface.x - DPIF(50), pc * ImGui::GetFontSize() * 1.45);
			if (ImGui::BeginListBox(str.c_str(), listSize)) { //, ImVec2(m_board_surface.x/3 -5, m_board_surface.y/2));
				for (auto pin : part->pins) {
					char ss[1024];
					snprintf(ss, sizeof(ss), "%4s  %s", pin->name.c_str(), pin->net->name.c_str());
					if (ImGui::Selectable(ss, (pin == m_pinSelected))) {
						ClearAllHighlights();

						if ((pin->type == Pin::kPinTypeNotConnected) || (pin->type == Pin::kPinTypeUnkown) || (pin->net->is_ground)) {
							m_partHighlighted.push_back(pin->component);
							// do nothing for now
							//
						} else {
							m_pinSelected = pin;
							for (auto p : m_partHighlighted) {
								pin->component->visualmode = pin->component->CVMNormal;
							};
							m_partHighlighted.push_back(pin->component);
							CenterZoomNet(pin->net->name);
						}
						m_needsRedraw = true;
					}
					ImGui::PushStyleColor(ImGuiCol_Border, 0xffeeeeee);
					ImGui::Separator();
					ImGui::PopStyleColor();
				}
				ImGui::EndListBox();
			}
			ImGui::PopItemWidth();

		} // for each part in the list
		ImGui::Text(" ");
		ImGui::Separator();
		ImGui::Separator();
		ImGui::Separator();
	}

	ImGui::End();
	ImGui::PopStyleVar();
}